

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestPartResult
          (StreamingListener *this,TestPartResult *test_part_result)

{
  uint uVar1;
  undefined8 uVar2;
  StreamingListener *this_00;
  char *str;
  char *str_00;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_70;
  String local_50;
  string local_40;
  StreamingListener *local_20;
  char *file_name;
  TestPartResult *test_part_result_local;
  StreamingListener *this_local;
  
  file_name = (char *)test_part_result;
  test_part_result_local = (TestPartResult *)this;
  local_20 = (StreamingListener *)TestPartResult::file_name(test_part_result);
  if (local_20 == (StreamingListener *)0x0) {
    local_20 = (StreamingListener *)0x16c700;
  }
  UrlEncode_abi_cxx11_(&local_70,local_20,str);
  uVar2 = std::__cxx11::string::c_str();
  uVar1 = TestPartResult::line_number((TestPartResult *)file_name);
  String::Format(&local_50,"event=TestPartResult&file=%s&line=%d&message=",uVar2,(ulong)uVar1);
  String::operator_cast_to_string(&local_40,&local_50);
  Send(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  String::~String(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  this_00 = (StreamingListener *)TestPartResult::message((TestPartResult *)file_name);
  UrlEncode_abi_cxx11_(&local_c0,this_00,str_00);
  std::operator+(&local_a0,&local_c0,"\n");
  Send(this,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

void OnTestPartResult(const TestPartResult& test_part_result) {
    const char* file_name = test_part_result.file_name();
    if (file_name == NULL)
      file_name = "";
    Send(String::Format("event=TestPartResult&file=%s&line=%d&message=",
                        UrlEncode(file_name).c_str(),
                        test_part_result.line_number()));
    Send(UrlEncode(test_part_result.message()) + "\n");
  }